

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O3

void do_equipment(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_DATA *pOVar2;
  char *pcVar3;
  long lVar4;
  basic_string_view<char> fmt;
  basic_string_view<char> format;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args_00;
  string buffer;
  long *local_298;
  undefined8 uStack_290;
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258;
  undefined8 uStack_250;
  buffer<char> local_248;
  char local_228 [504];
  
  send_to_char("You are using:\n\r",ch);
  lVar4 = 0;
  bVar1 = false;
  do {
    while( true ) {
      if (lVar4 == 0x10) {
        for (pOVar2 = ch->carrying; pOVar2 != (OBJ_DATA *)0x0; pOVar2 = pOVar2->next_content) {
          if (pOVar2->wear_loc == 0x15) {
            local_278[0] = (long *)pOVar2->wear_loc_name;
            if (local_278[0] == (long *)0x0) {
              local_278[0] = (long *)0x37dbe4;
            }
            local_248.size_ = 0;
            local_248._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
            local_248.capacity_ = 500;
            fmt.size_ = 3;
            fmt.data_ = "{}>";
            args.field_1.values_ =
                 (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_278;
            args.desc_ = 0xc;
            local_248.ptr_ = local_228;
            ::fmt::v9::detail::vformat_to<char>(&local_248,fmt,args,(locale_ref)0x0);
            local_298 = local_288;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_298,local_248.ptr_,local_248.ptr_ + local_248.size_);
            if (local_248.ptr_ != local_228) {
              operator_delete(local_248.ptr_,local_248.capacity_);
            }
            local_258 = local_298;
            uStack_250 = uStack_290;
            local_248.size_ = 0;
            local_248._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
            local_248.capacity_ = 500;
            format.size_ = 0xb;
            format.data_ = "<worn %-14s";
            args_00.field_1.values_ =
                 (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)&local_258;
            args_00.desc_ = 0xd;
            local_248.ptr_ = local_228;
            ::fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                      (&local_248,format,args_00);
            local_278[0] = local_268;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_278,local_248.ptr_,local_248.ptr_ + local_248.size_);
            if (local_248.ptr_ != local_228) {
              operator_delete(local_248.ptr_,local_248.capacity_);
            }
            std::__cxx11::string::operator=((string *)&local_298,(string *)local_278);
            if (local_278[0] != local_268) {
              operator_delete(local_278[0],local_268[0] + 1);
            }
            send_to_char((char *)local_298,ch);
            bVar1 = can_see_obj(ch,pOVar2);
            pcVar3 = "something.";
            if (bVar1) {
              format_obj_to_char(pOVar2,ch,true);
              pcVar3 = format_obj_to_char::buf;
            }
            send_to_char(pcVar3,ch);
            send_to_char("\n\r",ch);
            if (local_298 != local_288) {
              operator_delete(local_298,local_288[0] + 1);
            }
            bVar1 = true;
          }
        }
      }
      pOVar2 = get_eq_char(ch,(int)lVar4);
      if (pOVar2 == (OBJ_DATA *)0x0 || lVar4 == 0x15) break;
      send_to_char(where_name[lVar4],ch);
      bVar1 = can_see_obj(ch,pOVar2);
      pcVar3 = "something.";
      if (bVar1) {
        format_obj_to_char(pOVar2,ch,true);
        pcVar3 = format_obj_to_char::buf;
      }
      send_to_char(pcVar3,ch);
      send_to_char("\n\r",ch);
      lVar4 = lVar4 + 1;
      bVar1 = true;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x16);
  if (!bVar1) {
    send_to_char("Nothing.\n\r",ch);
  }
  return;
}

Assistant:

void do_equipment(CHAR_DATA *ch, char *argument)
{
	send_to_char("You are using:\n\r", ch);

	auto found = false;
	for (auto iWear = 0; iWear < MAX_WEAR; iWear++)
	{
		if (iWear == WEAR_WIELD) // cosmetics come right before "wield" on display
		{
			for (auto tObj = ch->carrying; tObj; tObj = tObj->next_content)
			{
				if (tObj->wear_loc == WEAR_COSMETIC)
				{
					auto buffer = fmt::format("{}>", tObj->wear_loc_name ? tObj->wear_loc_name : "bug: unset wear_loc on cosmetic");
					buffer = fmt::sprintf("<worn %-14s", buffer);
					send_to_char(buffer.c_str(), ch);

					if (can_see_obj(ch, tObj))
						send_to_char(format_obj_to_char(tObj, ch, true), ch);
					else
						send_to_char("something.", ch);

					send_to_char("\n\r", ch);
					found = true;
				}
			}
		}

		auto obj = get_eq_char(ch, iWear);
		if (iWear == WEAR_COSMETIC || obj == nullptr)
			continue;

		send_to_char(where_name[iWear], ch);

		if (can_see_obj(ch, obj))
			send_to_char(format_obj_to_char(obj, ch, true), ch);
		else
			send_to_char("something.", ch);

		send_to_char("\n\r", ch);
		found = true;
	}

	if (!found)
		send_to_char("Nothing.\n\r", ch);
}